

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O0

ssize_t __thiscall vox::SIZE::write(SIZE *this,int __fd,void *__buf,size_t __n)

{
  size_t sVar1;
  undefined4 in_register_00000034;
  undefined8 local_30;
  size_t childSize;
  size_t contentSize;
  FILE *pFStack_18;
  int32_t id;
  FILE *fp_local;
  SIZE *this_local;
  
  pFStack_18 = (FILE *)CONCAT44(in_register_00000034,__fd);
  fp_local = (FILE *)this;
  contentSize._4_4_ = GetMVID('S','I','Z','E');
  fwrite((void *)((long)&contentSize + 4),4,1,pFStack_18);
  childSize = getSize(this);
  fwrite(&childSize,4,1,pFStack_18);
  local_30 = 0;
  fwrite(&local_30,4,1,pFStack_18);
  fwrite(this,4,1,pFStack_18);
  fwrite(&this->sizey,4,1,pFStack_18);
  sVar1 = fwrite(&this->sizez,4,1,pFStack_18);
  return sVar1;
}

Assistant:

void SIZE::write(FILE* fp) {
    // chunk header
    int32_t id = GetMVID('S', 'I', 'Z', 'E');
    fwrite(&id, sizeof(int32_t), 1, fp);
    size_t contentSize = getSize();
    fwrite(&contentSize, sizeof(int32_t), 1, fp);
    size_t childSize = 0;
    fwrite(&childSize, sizeof(int32_t), 1, fp);

    // datas's
    fwrite(&sizex, sizeof(int32_t), 1, fp);
    fwrite(&sizey, sizeof(int32_t), 1, fp);
    fwrite(&sizez, sizeof(int32_t), 1, fp);
}